

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::tuple_caster<std::pair,long,long>::load_impl<0ul,1ul>
          (void *param_1,undefined8 param_2,byte param_3)

{
  undefined1 uVar1;
  const_iterator pbVar2;
  const_iterator pbVar3;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<bool> *__range3;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  accessor<pybind11::detail::accessor_policies::sequence_item> *in_stack_ffffffffffffff08;
  accessor<pybind11::detail::accessor_policies::sequence_item> *this;
  undefined8 in_stack_ffffffffffffff48;
  type_caster<long,_void> *in_stack_ffffffffffffff50;
  handle in_stack_ffffffffffffff58;
  bool local_3a;
  undefined1 local_39;
  initializer_list<bool> local_38;
  initializer_list<bool> *local_28;
  byte local_19;
  undefined8 local_18;
  void *local_10;
  
  uVar1 = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38);
  local_19 = param_3 & 1;
  local_18 = param_2;
  local_10 = param_1;
  std::get<0ul,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<long,void>>
            ((pair<pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<long,_void>_>
              *)0x391594);
  sequence::operator[]
            ((sequence *)in_stack_ffffffffffffff08,
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  accessor::operator_cast_to_object(in_stack_ffffffffffffff08);
  local_3a = type_caster<long,_void>::load
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,(bool)uVar1);
  this = (accessor<pybind11::detail::accessor_policies::sequence_item> *)&local_39;
  std::get<1ul,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<long,void>>
            ((pair<pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<long,_void>_>
              *)0x391622);
  sequence::operator[]
            ((sequence *)this,CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  accessor::operator_cast_to_object(this);
  uVar1 = type_caster<long,_void>::load
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,(bool)uVar1);
  *(undefined1 *)this = uVar1;
  local_38._M_array = &local_3a;
  local_38._M_len = 2;
  object::~object((object *)0x3916b5);
  accessor<pybind11::detail::accessor_policies::sequence_item>::~accessor
            ((accessor<pybind11::detail::accessor_policies::sequence_item> *)0x3916bf);
  object::~object((object *)0x3916cc);
  accessor<pybind11::detail::accessor_policies::sequence_item>::~accessor
            ((accessor<pybind11::detail::accessor_policies::sequence_item> *)0x3916d9);
  local_28 = &local_38;
  pbVar2 = std::initializer_list<bool>::begin(local_28);
  pbVar3 = std::initializer_list<bool>::end
                     ((initializer_list<bool> *)CONCAT17(uVar1,in_stack_ffffffffffffff00));
  while( true ) {
    if (pbVar2 == pbVar3) {
      return true;
    }
    if ((*pbVar2 & 1U) == 0) break;
    pbVar2 = pbVar2 + 1;
  }
  return false;
}

Assistant:

bool load_impl(const sequence &seq, bool convert, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(subcasters).load(seq[Is], convert)))
            return false;
#else
        for (bool r : {std::get<Is>(subcasters).load(seq[Is], convert)...})
            if (!r)
                return false;
#endif
        return true;
    }